

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec3 vec3_rotate_x(vec3 v,float theta)

{
  vec3 vVar1;
  float theta_local;
  vec3 v_local;
  
  vVar1 = vec3_create(1.0,0.0,0.0);
  vVar1 = vec3_rotate_about_axis(v,vVar1,theta);
  return vVar1;
}

Assistant:

vec3 vec3_rotate_x(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(1.0f, 0.0f, 0.0f), theta);
}